

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O2

void __thiscall Basis::deactivate(Basis *this,HighsInt conid)

{
  mapped_type *pmVar1;
  key_type_conflict1 local_14;
  
  pmVar1 = std::
           map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
           ::operator[](&this->basisstatus,&local_14);
  *pmVar1 = kInactiveInBasis;
  remove<int>(&this->active_constraint_index,&local_14);
  std::vector<int,_std::allocator<int>_>::push_back(&this->non_active_constraint_index,&local_14);
  return;
}

Assistant:

void Basis::deactivate(HighsInt conid) {
  // printf("deact %" HIGHSINT_FORMAT "\n", conid);
  assert(contains(active_constraint_index, conid));
  basisstatus[conid] = BasisStatus::kInactiveInBasis;
  remove(active_constraint_index, conid);
  non_active_constraint_index.push_back(conid);
}